

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_decimal_result<char_*> __thiscall
fmt::v7::detail::format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  int in_ECX;
  undefined4 in_register_00000014;
  ulong uVar1;
  detail *pdVar2;
  undefined1 auVar3 [16];
  format_decimal_result<char_*> fVar4;
  
  pdVar2 = this + (long)in_ECX + -2;
  uVar1 = CONCAT44(in_register_00000014,size);
  while ((out < (char *)0x64) <= uVar1) {
    auVar3 = __udivti3(out,uVar1,100,0);
    *(undefined2 *)pdVar2 =
         *(undefined2 *)(basic_data<void>::digits + (long)(out + (long)auVar3._0_8_ * -100) * 2);
    pdVar2 = pdVar2 + -2;
    out = auVar3._0_8_;
    uVar1 = auVar3._8_8_;
  }
  if (uVar1 == 0 && (ulong)((char *)0x9 < out) <= -uVar1) {
    pdVar2[1] = (detail)((byte)out | 0x30);
    pdVar2 = pdVar2 + 1;
  }
  else {
    *(undefined2 *)pdVar2 = *(undefined2 *)(basic_data<void>::digits + (long)out * 2);
  }
  fVar4.end = (char *)(this + in_ECX);
  fVar4.begin = (char *)pdVar2;
  return fVar4;
}

Assistant:

inline format_decimal_result<Char*> format_decimal(Char* out, UInt value,
                                                   int size) {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, data::digits[value % 100]);
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, data::digits[value]);
  return {out, end};
}